

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

double __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,true>::
extract_builtin_floating_point_type<double,void>(uintwide_t<256u,unsigned_int,void,true> *this)

{
  int *piVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  unsigned_fast_type uVar7;
  uint uVar8;
  int iVar9;
  ulong *puVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  double dVar14;
  local_unsigned_wide_integer_type u;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  double local_40;
  ulong local_38;
  ulong uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  
  iVar2 = *(int *)(this + 0x1c);
  local_58 = *(ulong *)(this + 0x10);
  uStack_50 = *(ulong *)(this + 0x18);
  local_68 = *(ulong *)this;
  uStack_60 = *(ulong *)(this + 8);
  if (iVar2 < 0) {
    local_68 = *(ulong *)this ^ 0xffffffffffffffff;
    uStack_60 = *(ulong *)(this + 8) ^ 0xffffffffffffffff;
    local_58 = *(ulong *)(this + 0x10) ^ 0xffffffffffffffff;
    uStack_50 = *(ulong *)(this + 0x18) ^ 0xffffffffffffffff;
    lVar5 = 0;
    do {
      piVar1 = (int *)((long)&local_68 + lVar5);
      *piVar1 = *piVar1 + 1;
      if (*piVar1 != 0) break;
      bVar13 = lVar5 != 0x1c;
      lVar5 = lVar5 + 4;
    } while (bVar13);
  }
  local_28 = local_58;
  uStack_20 = uStack_50;
  local_38 = local_68;
  uStack_30 = uStack_60;
  iVar12 = 8;
  lVar5 = 0;
  do {
    lVar6 = lVar5;
    if (lVar6 == -0x20) {
      uVar8 = 1;
      goto LAB_00130498;
    }
    iVar12 = iVar12 + -1;
    lVar5 = lVar6 + -4;
  } while (*(int *)((long)&uStack_20 + lVar6 + 4) == 0);
  uVar7 = detail::msb_helper<unsigned_int>((uint32_t *)((long)&uStack_20 + lVar6 + 4));
  uVar8 = (int)uVar7 + iVar12 * 0x20 + 1;
LAB_00130498:
  iVar12 = (uint)((uVar8 & 0x1f) != 0) + (uVar8 >> 5);
  if (iVar12 == 0) {
    dVar14 = 0.0;
  }
  else {
    iVar9 = 0;
    puVar10 = &local_38;
    dVar4 = 1.0;
    dVar14 = 0.0;
    do {
      uVar8 = 1;
      iVar11 = 0x20;
      dVar3 = 0.0;
      do {
        local_40 = dVar3 + dVar4;
        if (((uint)*puVar10 & uVar8) == 0) {
          local_40 = dVar3;
        }
        uVar8 = uVar8 * 2;
        dVar4 = dVar4 + dVar4;
        iVar11 = iVar11 + -1;
        dVar3 = local_40;
      } while (iVar11 != 0);
      dVar14 = dVar14 + local_40;
      puVar10 = (ulong *)((long)puVar10 + 4);
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar12);
  }
  if (iVar2 < 0) {
    dVar14 = -dVar14;
  }
  return dVar14;
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }